

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O0

void __thiscall
TypeFactory::setCoreType(TypeFactory *this,string *name,int4 size,type_metatype meta,bool chartp)

{
  TypeCode *local_30;
  Datatype *ct;
  bool chartp_local;
  type_metatype meta_local;
  int4 size_local;
  string *name_local;
  TypeFactory *this_local;
  
  if (chartp) {
    if (size == 1) {
      local_30 = (TypeCode *)getTypeChar(this,name);
    }
    else {
      local_30 = (TypeCode *)getTypeUnicode(this,name,size,meta);
    }
  }
  else if (meta == TYPE_CODE) {
    local_30 = getTypeCode(this,name);
  }
  else if (meta == TYPE_VOID) {
    local_30 = (TypeCode *)getTypeVoid(this);
  }
  else {
    local_30 = (TypeCode *)getBase(this,size,meta,name);
  }
  (local_30->super_Datatype).flags = (local_30->super_Datatype).flags | 1;
  return;
}

Assistant:

void TypeFactory::setCoreType(const string &name,int4 size,
			      type_metatype meta,bool chartp)
{
  Datatype *ct;
  if (chartp) {
    if (size == 1)
      ct = getTypeChar(name);
    else
      ct = getTypeUnicode(name,size,meta);
  }
  else if (meta == TYPE_CODE)
    ct = getTypeCode(name);
  else if (meta == TYPE_VOID)
    ct = getTypeVoid();
  else
    ct = getBase(size,meta,name);
  ct->flags |= Datatype::coretype;
}